

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

void calcBias<Blob<448>,Blob<224>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  int iBit;
  uint32_t bit;
  int iOut;
  uint32_t bit_00;
  Blob<224> B;
  Blob<224> A;
  Blob<448> K;
  undefined1 local_a8 [12];
  undefined4 local_9c;
  undefined1 auStack_98 [12];
  undefined1 local_88 [12];
  undefined4 local_7c;
  undefined1 auStack_78 [12];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  local_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  auStack_78 = SUB1612(ZEXT416(0) << 0x40,4);
  local_88 = SUB1612(ZEXT416(0) << 0x40,0);
  local_7c = 0;
  if (0 < reps) {
    uVar4 = 0;
    local_a8 = local_88;
    local_9c = local_7c;
    auStack_98 = auStack_78;
    do {
      if ((verbose) && ((int)(uVar4 % ((ulong)(uint)reps / 10)) == 0)) {
        putchar(0x2e);
      }
      Rand::rand_p(r,&local_68,0x38);
      bit = 0;
      (*hash)(&local_68,0x38,0,local_88);
      piVar5 = (counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        flipbit(&local_68,0x38,bit);
        (*hash)(&local_68,0x38,0,local_a8);
        flipbit(&local_68,0x38,bit);
        bit_00 = 0;
        do {
          uVar1 = getbit(local_88,0x1c,bit_00);
          uVar2 = getbit(local_a8,0x1c,bit_00);
          bit_00 = bit_00 + 1;
          *piVar5 = *piVar5 + (uVar2 ^ uVar1);
          piVar5 = piVar5 + 1;
        } while (bit_00 != 0xe0);
        bit = bit + 1;
      } while (bit != 0x1c0);
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != reps);
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}